

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlRegexpPrint(FILE *output,xmlRegexpPtr regexp)

{
  uint local_1c;
  int i;
  xmlRegexpPtr regexp_local;
  FILE *output_local;
  
  if (output != (FILE *)0x0) {
    fprintf((FILE *)output," regexp: ");
    if (regexp == (xmlRegexpPtr)0x0) {
      fprintf((FILE *)output,"NULL\n");
    }
    else {
      fprintf((FILE *)output,"\'%s\' ",regexp->string);
      fprintf((FILE *)output,"\n");
      fprintf((FILE *)output,"%d atoms:\n",(ulong)(uint)regexp->nbAtoms);
      for (local_1c = 0; (int)local_1c < regexp->nbAtoms; local_1c = local_1c + 1) {
        fprintf((FILE *)output," %02d ",(ulong)local_1c);
        xmlRegPrintAtom(output,regexp->atoms[(int)local_1c]);
      }
      fprintf((FILE *)output,"%d states:",(ulong)(uint)regexp->nbStates);
      fprintf((FILE *)output,"\n");
      for (local_1c = 0; (int)local_1c < regexp->nbStates; local_1c = local_1c + 1) {
        xmlRegPrintState(output,regexp->states[(int)local_1c]);
      }
      fprintf((FILE *)output,"%d counters:\n",(ulong)(uint)regexp->nbCounters);
      for (local_1c = 0; (int)local_1c < regexp->nbCounters; local_1c = local_1c + 1) {
        fprintf((FILE *)output," %d: min %d max %d\n",(ulong)local_1c,
                (ulong)(uint)regexp->counters[(int)local_1c].min,
                (ulong)(uint)regexp->counters[(int)local_1c].max);
      }
    }
  }
  return;
}

Assistant:

void
xmlRegexpPrint(FILE *output, xmlRegexpPtr regexp) {
    int i;

    if (output == NULL)
        return;
    fprintf(output, " regexp: ");
    if (regexp == NULL) {
	fprintf(output, "NULL\n");
	return;
    }
    fprintf(output, "'%s' ", regexp->string);
    fprintf(output, "\n");
    fprintf(output, "%d atoms:\n", regexp->nbAtoms);
    for (i = 0;i < regexp->nbAtoms; i++) {
	fprintf(output, " %02d ", i);
	xmlRegPrintAtom(output, regexp->atoms[i]);
    }
    fprintf(output, "%d states:", regexp->nbStates);
    fprintf(output, "\n");
    for (i = 0;i < regexp->nbStates; i++) {
	xmlRegPrintState(output, regexp->states[i]);
    }
    fprintf(output, "%d counters:\n", regexp->nbCounters);
    for (i = 0;i < regexp->nbCounters; i++) {
	fprintf(output, " %d: min %d max %d\n", i, regexp->counters[i].min,
		                                regexp->counters[i].max);
    }
}